

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O2

string * stackjit::anon_unknown_16::findInheritedMemberFunction
                   (string *__return_storage_ptr__,VMState *vmState,string *initialSignature,
                   ClassType *classType,string *name,
                   vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                   *parameters)

{
  bool bVar1;
  string *psVar2;
  Binder *this;
  ClassMetadata *pCVar3;
  ClassType *pCVar4;
  string signature;
  string local_d8;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *local_b8;
  string *local_b0;
  _Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_a8;
  string local_90;
  FunctionSignature local_70;
  string local_50;
  
  local_b0 = name;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  local_b8 = parameters;
  FunctionSignature::memberFunction(&local_70,classType,&local_50,parameters);
  psVar2 = FunctionSignature::str_abi_cxx11_(&local_70);
  std::__cxx11::string::string((string *)&local_d8,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (initialSignature->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)initialSignature);
  }
  this = VMState::binder(vmState);
  bVar1 = Binder::isDefined(this,&local_d8);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_d8._M_string_length;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    pCVar3 = ClassType::metadata(classType);
    pCVar4 = ClassMetadata::parentClass(pCVar3);
    if (pCVar4 == (ClassType *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)initialSignature);
    }
    else {
      pCVar3 = ClassType::metadata(classType);
      pCVar4 = ClassMetadata::parentClass(pCVar3);
      std::__cxx11::string::string((string *)&local_90,(string *)local_b0);
      std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
                ((vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)
                 &local_a8,local_b8);
      findInheritedMemberFunction
                (__return_storage_ptr__,vmState,initialSignature,pCVar4,&local_90,
                 (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)
                 &local_a8);
      std::_Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::
      ~_Vector_base(&local_a8);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string findInheritedMemberFunction(const VMState& vmState,
												std::string& initialSignature,
												const ClassType* classType,
												std::string name,
												const std::vector<const Type*> parameters) {
			std::string signature = FunctionSignature::memberFunction(
				classType,
				name,
				parameters).str();

			if (initialSignature.empty()) {
				initialSignature = signature;
			}

			if (vmState.binder().isDefined(signature)) {
				return signature;
			}

			if (classType->metadata()->parentClass() != nullptr) {
				return findInheritedMemberFunction(
					vmState,
					initialSignature,
					classType->metadata()->parentClass(),
					name,
					parameters);
			} else {
				return initialSignature;
			}
		}